

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

char * BinaryenTryGetCatchTagAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xe8d,
                  "const char *BinaryenTryGetCatchTagAt(BinaryenExpressionRef, BinaryenIndex)");
  }
  if ((ulong)index < *(ulong *)(expr + 3)) {
    return *(char **)(expr[2].type.id + 8 + (ulong)index * 0x10);
  }
  __assert_fail("index < static_cast<Try*>(expression)->catchTags.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xe8e,"const char *BinaryenTryGetCatchTagAt(BinaryenExpressionRef, BinaryenIndex)")
  ;
}

Assistant:

const char* BinaryenTryGetCatchTagAt(BinaryenExpressionRef expr,
                                     BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchTags.size());
  return static_cast<Try*>(expression)->catchTags[index].str.data();
}